

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

bool __thiscall SessionManager::haveSession(SessionManager *this,CK_SLOT_ID slotID)

{
  pointer ppSVar1;
  Slot *this_00;
  CK_SLOT_ID CVar2;
  pointer ppSVar3;
  MutexLocker lock;
  MutexLocker local_30;
  
  MutexLocker::MutexLocker(&local_30,this->sessionsMutex);
  for (ppSVar3 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    if (*ppSVar3 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar3);
      CVar2 = Slot::getSlotID(this_00);
      if (CVar2 == slotID) break;
    }
  }
  MutexLocker::~MutexLocker(&local_30);
  return ppSVar3 != ppSVar1;
}

Assistant:

bool SessionManager::haveSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			return true;
		}
	}

	return false;
}